

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O3

char * __thiscall moira::Moira::availabilityString(Moira *this,Instr I,Mode M,Size S,u16 ext)

{
  u16 uVar1;
  
  uVar1 = availabilityMask(this,I,M,S,ext);
  if (uVar1 < 0x1c0) {
    if (uVar1 == 0xc) {
      return "(2)";
    }
    if (uVar1 == 0x3c) {
      return "(2-3)";
    }
  }
  else {
    if (uVar1 == 0x1c0) {
      return "(4+)";
    }
    if (uVar1 == 0x1fc) {
      return "(2+)";
    }
    if (uVar1 == 0x1fe) {
      return "(1+)";
    }
  }
  return "(?)";
}

Assistant:

const char *
Moira::availabilityString(Instr I, Mode M, Size S, u16 ext)
{
    switch (availabilityMask(I, M, S, ext)) {

        case AV::M68010_UP:           return "(1+)";
        case AV::M68020:              return "(2)";
        case AV::M68020 | AV::M68030: return "(2-3)";
        case AV::M68020_UP:           return "(2+)";
        case AV::M68040:              return "(4+)";

        default:
            return "(?)";
    }
}